

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  _Bool _Var1;
  char *pcVar2;
  __int32_t **pp_Var3;
  char letter;
  uint uVar4;
  char word_b [1024];
  char word_a [1024];
  char local_828 [1024];
  char local_428 [1032];
  
  puts("Tell me two words and I will tell you their letters in common!");
  do {
    printf("> ");
    pcVar2 = fgets(local_428,0x400,_stdin);
    if (pcVar2 == (char *)0x0) {
      return 1;
    }
  } while (local_428[0] == '\n');
  do {
    printf("> ");
    pcVar2 = fgets(local_828,0x400,_stdin);
    if (pcVar2 == (char *)0x0) {
      return 1;
    }
  } while (local_828[0] == '\n');
  if (local_428[0] != '\0') {
    pp_Var3 = __ctype_toupper_loc();
    pcVar2 = local_428;
    do {
      pcVar2 = pcVar2 + 1;
      pcVar2[-1] = (char)(*pp_Var3)[local_428[0]];
      local_428[0] = *pcVar2;
    } while (local_428[0] != '\0');
  }
  if (local_828[0] != '\0') {
    pp_Var3 = __ctype_toupper_loc();
    pcVar2 = local_828;
    do {
      *pcVar2 = (char)(*pp_Var3)[local_828[0]];
      local_828[0] = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while (local_828[0] != '\0');
  }
  printf("These two words have in common the following letters: ");
  uVar4 = 0x41;
  do {
    _Var1 = is_present((char)uVar4,local_428);
    if ((_Var1) && (_Var1 = is_present((char)uVar4,local_828), _Var1)) {
      printf("%c ",(ulong)uVar4);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x5b);
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word_a[1024];
  char word_b[1024];
  printf("Tell me two words and I will tell you their letters in common!\n");

  do {
    printf("> ");
    if (fgets(word_a, sizeof word_a, stdin) == NULL) return 1;
  } while (word_a[0] == '\n');
  do {
    printf("> ");
    if (fgets(word_b, sizeof word_b, stdin) == NULL) return 1;
  } while (word_b[0] == '\n');

  // Compact toupper, cf. 13.1
  for (size_t n = 0; word_a[n]; n++) word_a[n] = (char)toupper(word_a[n]);
  for (size_t n = 0; word_b[n]; n++) word_b[n] = (char)toupper(word_b[n]);

  printf("These two words have in common the following letters: ");
  for (char letter = 'A'; letter <= 'Z'; letter++) {
    if (is_present(letter, word_a) && is_present(letter, word_b)) {
      printf("%c ", letter);
    }
  }
  printf("\n");
  return 0;
}